

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

ModsqrtContext * modsqrt_new(mp_int *p,mp_int *any_nonsquare_mod_p)

{
  size_t sVar1;
  uint uVar2;
  ModsqrtContext *pMVar3;
  mp_int *pmVar4;
  MontyContext *mc;
  ulong bit;
  
  pMVar3 = (ModsqrtContext *)safemalloc(1,0x38,0);
  pMVar3->p = (mp_int *)0x0;
  pMVar3->mc = (MontyContext *)0x0;
  pMVar3->e = 0;
  pMVar3->k = (mp_int *)0x0;
  pMVar3->km1o2 = (mp_int *)0x0;
  pMVar3->z = (mp_int *)0x0;
  pMVar3->zk = (mp_int *)0x0;
  pmVar4 = mp_copy(p);
  pMVar3->p = pmVar4;
  mc = monty_new(pmVar4);
  pMVar3->mc = mc;
  pmVar4 = monty_import(mc,any_nonsquare_mod_p);
  pMVar3->z = pmVar4;
  sVar1 = p->nw;
  for (bit = 1; pMVar3->e = bit, bit < sVar1 << 6; bit = bit + 1) {
    uVar2 = mp_get_bit(p,bit);
    if (uVar2 != 0) break;
  }
  pmVar4 = mp_rshift_fixed(p,bit);
  pMVar3->k = pmVar4;
  pmVar4 = mp_rshift_fixed(pmVar4,1);
  pMVar3->km1o2 = pmVar4;
  return pMVar3;
}

Assistant:

ModsqrtContext *modsqrt_new(mp_int *p, mp_int *any_nonsquare_mod_p)
{
    ModsqrtContext *sc = snew(ModsqrtContext);
    memset(sc, 0, sizeof(ModsqrtContext));

    sc->p = mp_copy(p);
    sc->mc = monty_new(sc->p);
    sc->z = monty_import(sc->mc, any_nonsquare_mod_p);

    /* Find the lowest set bit in p-1. Since this routine expects p to
     * be non-secret (typically a well-known standard elliptic curve
     * parameter), for once we don't need clever bit tricks. */
    for (sc->e = 1; sc->e < BIGNUM_INT_BITS * p->nw; sc->e++)
        if (mp_get_bit(p, sc->e))
            break;

    sc->k = mp_rshift_fixed(p, sc->e);
    sc->km1o2 = mp_rshift_fixed(sc->k, 1);

    /* Leave zk to be filled in lazily, since it's more expensive to
     * compute. If this context turns out never to be needed, we can
     * save the bulk of the setup time this way. */

    return sc;
}